

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

char ** __thiscall Array<const_char_*>::append(Array<const_char_*> *this,char **value)

{
  char **ppcVar1;
  char **item;
  usize size;
  char **value_local;
  Array<const_char_*> *this_local;
  
  reserve(this,((long)(this->_end).item - (long)(this->_begin).item >> 3) + 1);
  ppcVar1 = (this->_end).item;
  *ppcVar1 = *value;
  (this->_end).item = (this->_end).item + 1;
  return ppcVar1;
}

Assistant:

T& append(const T& value)
  {
    usize size = _end.item - _begin.item;
    reserve(size + 1);
    T* item = _end.item;
#ifdef VERIFY
    VERIFY(new(item) T(value) == item);
#else
    new(item) T(value);
#endif
    ++_end.item;
    return *item;
  }